

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix,
               _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix,ParseNode *pnodeParent)

{
  code *pcVar1;
  ByteCodeGenerator *pnode_00;
  bool bVar2;
  ScriptContext *scriptContext;
  ParseNodeUni *pPVar3;
  ParseNodeBin *pPVar4;
  ParseNodeSuperReference *pPVar5;
  ParseNodeParamPattern *pPVar6;
  ParseNodeSuperCall *pPVar7;
  ParseNodeCall *pPVar8;
  ParseNodeTri *pPVar9;
  ParseNodeVar *pPVar10;
  ParseNodeClass *pPVar11;
  ParseNodeStrTemplate *pPVar12;
  ParseNodeExportDefault *pPVar13;
  ParseNodeFnc *pPVar14;
  undefined4 *puVar15;
  ParseNodeProg *pPVar16;
  ParseNodeFor *pPVar17;
  ParseNodeIf *pPVar18;
  ParseNodeWhile *pPVar19;
  ParseNodeForInOrForOf *pPVar20;
  ParseNodeReturn *pPVar21;
  ParseNodeBlock *pnode_01;
  ParseNode *pPVar22;
  ParseNodeWith *pPVar23;
  ParseNodeSwitch *pPVar24;
  ParseNodeCase *pPVar25;
  ParseNodeTryFinally *pPVar26;
  ParseNodeTryCatch *pPVar27;
  ParseNodeTry *pPVar28;
  ParseNodeCatch *pPVar29;
  ParseNodePtr pnode_02;
  ParseNodeFinally *pPVar30;
  ParseNode *pnodeRhs;
  undefined1 local_78 [8];
  SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> rhsStack;
  ArenaAllocator *alloc;
  ParseNode *pnode1;
  ParseNodeCase *pPStack_48;
  bool arrayLitOpt;
  ParseNodeCase *pnodeT;
  ParseNodeBlock *pnodeBlock;
  uint i;
  uint flags;
  ParseNode *pnodeParent_local;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix_local;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  if (pnode != (ParseNode *)0x0) {
    _i = pnodeParent;
    pnodeParent_local = (ParseNode *)postfix;
    postfix_local = prefix;
    prefix_local = (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)byteCodeGenerator;
    byteCodeGenerator_local = (ByteCodeGenerator *)pnode;
    scriptContext = ByteCodeGenerator::GetScriptContext(byteCodeGenerator);
    ThreadContext::ProbeCurrentStackNoDispose(0x2400,scriptContext);
    (*postfix_local)((ParseNode *)byteCodeGenerator_local,(ByteCodeGenerator *)prefix_local);
    switch(*(undefined1 *)&byteCodeGenerator_local->scriptContext) {
    case 0x16:
      pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar3->pnode1,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      break;
    default:
      pnodeBlock._4_4_ = ParseNode::Grfnop((uint)*(byte *)&byteCodeGenerator_local->scriptContext);
      if ((pnodeBlock._4_4_ & 4) == 0) {
        if ((pnodeBlock._4_4_ & 8) != 0) {
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
          Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                    (pPVar4->pnode1,(ByteCodeGenerator *)prefix_local,postfix_local,
                     (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                     (ParseNode *)0x0);
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
          Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                    (pPVar4->pnode2,(ByteCodeGenerator *)prefix_local,postfix_local,
                     (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                     (ParseNode *)0x0);
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
          bVar2 = ByteCodeGenerator::IsSuper(pPVar4->pnode1);
          if (bVar2) {
            pPVar5 = ParseNode::AsParseNodeSuperReference((ParseNode *)byteCodeGenerator_local);
            Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                      ((ParseNode *)pPVar5->pnodeThis,(ByteCodeGenerator *)prefix_local,
                       postfix_local,
                       (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                       (ParseNode *)0x0);
          }
        }
      }
      else {
        pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar3->pnode1,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
      }
      break;
    case 0x19:
      bVar2 = EmitAsConstantArray((ParseNode *)byteCodeGenerator_local,
                                  (ByteCodeGenerator *)prefix_local);
      if (!bVar2) {
        pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar3->pnode1,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
      }
      break;
    case 0x2f:
      pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar8->pnodeTarget,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar8->pnodeArgs,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      if (((byte)pPVar8->field_0x24 >> 3 & 1) != 0) {
        pPVar7 = ParseNode::AsParseNodeSuperCall((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  ((ParseNode *)pPVar7->pnodeThis,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
        pPVar7 = ParseNode::AsParseNodeSuperCall((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  ((ParseNode *)pPVar7->pnodeNewTarget,(ByteCodeGenerator *)prefix_local,
                   postfix_local,(_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local
                   ,(ParseNode *)0x0);
      }
      break;
    case 0x36:
      pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
      alloc = (ArenaAllocator *)pPVar4->pnode1;
      if (((ParseNode *)alloc)->nop == knopComma) {
        rhsStack.allocator = ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)prefix_local);
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::SList
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_78,
                   rhsStack.allocator);
        do {
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)alloc);
          SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Push
                    ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_78,
                     &pPVar4->pnode2);
          pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)alloc);
          alloc = (ArenaAllocator *)pPVar4->pnode1;
        } while (((ParseNode *)alloc)->nop == knopComma);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  ((ParseNode *)alloc,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
        while (bVar2 = SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Empty
                                 ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                                  local_78), ((bVar2 ^ 0xffU) & 1) != 0) {
          pPVar22 = SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Pop
                              ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_78);
          Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                    (pPVar22,(ByteCodeGenerator *)prefix_local,postfix_local,
                     (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                     (ParseNode *)0x0);
        }
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::~SList
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_78);
      }
      else {
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  ((ParseNode *)alloc,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
      }
      pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar4->pnode2,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      break;
    case 0x3d:
      pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar8->pnodeTarget,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      bVar2 = IsCallOfConstants((ParseNode *)byteCodeGenerator_local);
      if (!bVar2) {
        pPVar8 = ParseNode::AsParseNodeCall((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar8->pnodeArgs,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
      }
      break;
    case 0x3f:
      pPVar9 = ParseNode::AsParseNodeTri((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar9->pnode1,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar9 = ParseNode::AsParseNodeTri((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar9->pnode2,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar9 = ParseNode::AsParseNodeTri((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar9->pnode3,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      break;
    case 0x50:
      VisitList<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)byteCodeGenerator_local,(ByteCodeGenerator *)prefix_local,
                 postfix_local,(_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local);
      break;
    case 0x51:
    case 0x52:
    case 0x53:
      pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
      if (pPVar10->pnodeInit != (ParseNodePtr)0x0) {
        pPVar10 = ParseNode::AsParseNodeVar((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar10->pnodeInit,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
      }
      break;
    case 0x55:
      break;
    case 0x56:
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (&pPVar11->pnodeDeclName->super_ParseNode,(ByteCodeGenerator *)prefix_local,
                 postfix_local,(_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar11->pnodeBlock,(ByteCodeGenerator *)prefix_local);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar11->pnodeExtends,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (&pPVar11->pnodeName->super_ParseNode,(ByteCodeGenerator *)prefix_local,
                 postfix_local,(_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (&pPVar11->pnodeConstructor->super_ParseNode,(ByteCodeGenerator *)prefix_local,
                 postfix_local,(_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar11->pnodeMembers,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar11 = ParseNode::AsParseNodeClass((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar11->pnodeBlock,(ByteCodeGenerator *)prefix_local);
      break;
    case 0x57:
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      if (pPVar14->pnodeBody == (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x152,"(pnode->AsParseNodeFnc()->pnodeBody)",
                           "pnode->AsParseNodeFnc()->pnodeBody");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 0;
      }
      pnodeBlock._0_4_ = 0;
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      VisitNestedScopes<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)pPVar14->pnodeScopes,(ParseNode *)byteCodeGenerator_local,
                 (ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (uint *)&pnodeBlock,false);
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar14->pnodeScopes,(ByteCodeGenerator *)prefix_local);
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      pPVar22 = VisitBlock<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                          (pPVar14->pnodeBody,(ByteCodeGenerator *)prefix_local,postfix_local,
                           (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                           (ParseNode *)0x0);
      pPVar16 = ParseNode::AsParseNodeProg((ParseNode *)byteCodeGenerator_local);
      pPVar16->pnodeLastValStmt = pPVar22;
      pPVar14 = ParseNode::AsParseNodeFnc((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar14->pnodeScopes,(ByteCodeGenerator *)prefix_local);
      break;
    case 0x5b:
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar17->pnodeBlock,(ByteCodeGenerator *)prefix_local);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar17->pnodeInit,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      ByteCodeGenerator::EnterLoop((ByteCodeGenerator *)prefix_local);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar17->pnodeCond,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar17->pnodeIncr,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar17->pnodeBody,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      ByteCodeGenerator::ExitLoop((ByteCodeGenerator *)prefix_local);
      pPVar17 = ParseNode::AsParseNodeFor((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar17->pnodeBlock,(ByteCodeGenerator *)prefix_local);
      break;
    case 0x5c:
      pPVar18 = ParseNode::AsParseNodeIf((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar18->pnodeCond,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar18 = ParseNode::AsParseNodeIf((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar18->pnodeTrue,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      pPVar18 = ParseNode::AsParseNodeIf((ParseNode *)byteCodeGenerator_local);
      if (pPVar18->pnodeFalse != (ParseNodePtr)0x0) {
        pPVar18 = ParseNode::AsParseNodeIf((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar18->pnodeFalse,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)byteCodeGenerator_local);
      }
      break;
    case 0x5d:
    case 0x5e:
      ByteCodeGenerator::EnterLoop((ByteCodeGenerator *)prefix_local);
      pPVar19 = ParseNode::AsParseNodeWhile((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar19->pnodeCond,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar19 = ParseNode::AsParseNodeWhile((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar19->pnodeBody,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      ByteCodeGenerator::ExitLoop((ByteCodeGenerator *)prefix_local);
      break;
    case 0x5f:
    case 0x60:
    case 0x61:
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar20->pnodeBlock,(ByteCodeGenerator *)prefix_local);
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar20->pnodeLval,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar20->pnodeObj,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      ByteCodeGenerator::EnterLoop((ByteCodeGenerator *)prefix_local);
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar20->pnodeBody,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      ByteCodeGenerator::ExitLoop((ByteCodeGenerator *)prefix_local);
      pPVar20 = ParseNode::AsParseNodeForInOrForOf((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar20->pnodeBlock,(ByteCodeGenerator *)prefix_local);
      break;
    case 0x62:
      pnode_01 = ParseNode::AsParseNodeBlock((ParseNode *)byteCodeGenerator_local);
      if (pnode_01->pnodeStmt == (ParseNodePtr)0x0) {
        pnode_01->pnodeLastValStmt = (ParseNodePtr)0x0;
      }
      else {
        BeginVisitBlock(pnode_01,(ByteCodeGenerator *)prefix_local);
        pPVar22 = VisitBlock<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                            (pnode_01->pnodeStmt,(ByteCodeGenerator *)prefix_local,postfix_local,
                             (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                             (ParseNode *)byteCodeGenerator_local);
        pnode_01->pnodeLastValStmt = pPVar22;
        EndVisitBlock(pnode_01,(ByteCodeGenerator *)prefix_local);
      }
      break;
    case 99:
      pPVar12 = ParseNode::AsParseNodeStrTemplate((ParseNode *)byteCodeGenerator_local);
      if ((pPVar12->field_0x2a & 1) == 0) {
        pPVar12 = ParseNode::AsParseNodeStrTemplate((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar12->pnodeStringLiterals,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
      }
      pPVar12 = ParseNode::AsParseNodeStrTemplate((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar12->pnodeSubstitutionExpressions,(ByteCodeGenerator *)prefix_local,
                 postfix_local,(_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      break;
    case 100:
      pPVar23 = ParseNode::AsParseNodeWith((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar23->pnodeObj,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pnode_00 = byteCodeGenerator_local;
      pPVar23 = ParseNode::AsParseNodeWith((ParseNode *)byteCodeGenerator_local);
      VisitWithStmt<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)pnode_00,pPVar23->pnodeObj->location,(ByteCodeGenerator *)prefix_local
                 ,postfix_local,(_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x65:
      break;
    case 0x66:
      break;
    case 0x67:
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar24->pnodeVal,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      BeginVisitBlock(pPVar24->pnodeBlock,(ByteCodeGenerator *)prefix_local);
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      for (pPStack_48 = pPVar24->pnodeCases; pPStack_48 != (ParseNodeCase *)0x0;
          pPStack_48 = pPStack_48->pnodeNext) {
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  ((ParseNode *)pPStack_48,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)byteCodeGenerator_local);
      }
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)pPVar24->pnodeBlock,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar24 = ParseNode::AsParseNodeSwitch((ParseNode *)byteCodeGenerator_local);
      EndVisitBlock(pPVar24->pnodeBlock,(ByteCodeGenerator *)prefix_local);
      break;
    case 0x68:
      pPVar25 = ParseNode::AsParseNodeCase((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar25->pnodeExpr,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar25 = ParseNode::AsParseNodeCase((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)pPVar25->pnodeBody,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x69:
      pPVar27 = ParseNode::AsParseNodeTryCatch((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)pPVar27->pnodeTry,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      pPVar27 = ParseNode::AsParseNodeTryCatch((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)pPVar27->pnodeCatch,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x6a:
      BeginVisitCatch((ParseNode *)byteCodeGenerator_local,(ByteCodeGenerator *)prefix_local);
      pPVar29 = ParseNode::AsParseNodeCatch((ParseNode *)byteCodeGenerator_local);
      pnode_02 = ParseNodeCatch::GetParam(pPVar29);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pnode_02,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      pPVar29 = ParseNode::AsParseNodeCatch((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar29->pnodeBody,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      EndVisitCatch((ParseNode *)byteCodeGenerator_local,(ByteCodeGenerator *)prefix_local);
      break;
    case 0x6b:
      pPVar21 = ParseNode::AsParseNodeReturn((ParseNode *)byteCodeGenerator_local);
      if (pPVar21->pnodeExpr != (ParseNodePtr)0x0) {
        pPVar21 = ParseNode::AsParseNodeReturn((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar21->pnodeExpr,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
      }
      break;
    case 0x6c:
      pPVar28 = ParseNode::AsParseNodeTry((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar28->pnodeBody,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x6d:
      pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar3->pnode1,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      break;
    case 0x6e:
      pPVar30 = ParseNode::AsParseNodeFinally((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar30->pnodeBody,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x6f:
      pPVar26 = ParseNode::AsParseNodeTryFinally((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)pPVar26->pnodeTry,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      pPVar26 = ParseNode::AsParseNodeTryFinally((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((ParseNode *)pPVar26->pnodeFinally,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)byteCodeGenerator_local);
      break;
    case 0x72:
      bVar2 = ByteCodeGenerator::InDestructuredPattern((ByteCodeGenerator *)prefix_local);
      if (bVar2) {
        pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar3->pnode1,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
      }
      else {
        ByteCodeGenerator::SetInDestructuredPattern((ByteCodeGenerator *)prefix_local,true);
        pPVar3 = ParseNode::AsParseNodeUni((ParseNode *)byteCodeGenerator_local);
        Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                  (pPVar3->pnode1,(ByteCodeGenerator *)prefix_local,postfix_local,
                   (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                   (ParseNode *)0x0);
        ByteCodeGenerator::SetInDestructuredPattern((ByteCodeGenerator *)prefix_local,false);
      }
      break;
    case 0x73:
      pPVar6 = ParseNode::AsParseNodeParamPattern((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                ((pPVar6->super_ParseNodeUni).pnode1,(ByteCodeGenerator *)prefix_local,postfix_local
                 ,(_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
      break;
    case 0x74:
      pPVar13 = ParseNode::AsParseNodeExportDefault((ParseNode *)byteCodeGenerator_local);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar13->pnodeExpr,(ByteCodeGenerator *)prefix_local,postfix_local,
                 (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr *)pnodeParent_local,
                 (ParseNode *)0x0);
    }
    if (_i != (ParseNode *)0x0) {
      PropagateFlags((ParseNode *)byteCodeGenerator_local,_i);
    }
    (*(code *)pnodeParent_local)(byteCodeGenerator_local,prefix_local);
  }
  return;
}

Assistant:

void Visit(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent)
{
    if (pnode == nullptr)
    {
        return;
    }

    ThreadContext::ProbeCurrentStackNoDispose(Js::Constants::MinStackByteCodeVisitor, byteCodeGenerator->GetScriptContext());

    prefix(pnode, byteCodeGenerator);
    switch (pnode->nop)
    {
    default:
    {
        uint flags = ParseNode::Grfnop(pnode->nop);
        if (flags&fnopUni)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        else if (flags&fnopBin)
        {
            Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);

            if (ByteCodeGenerator::IsSuper(pnode->AsParseNodeBin()->pnode1))
            {
                Visit(pnode->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, prefix, postfix);
            }
        }

        break;
    }

    case knopParamPattern:
        Visit(pnode->AsParseNodeParamPattern()->pnode1, byteCodeGenerator, prefix, postfix);
        break;

    case knopArrayPattern:
        if (!byteCodeGenerator->InDestructuredPattern())
        {
            byteCodeGenerator->SetInDestructuredPattern(true);
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
            byteCodeGenerator->SetInDestructuredPattern(false);
        }
        else
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopCall:
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);

        if (pnode->AsParseNodeCall()->isSuperCall)
        {
            Visit(pnode->AsParseNodeSuperCall()->pnodeThis, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeSuperCall()->pnodeNewTarget, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopNew:
    {
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        if (!IsCallOfConstants(pnode))
        {
            Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);
        }
        break;
    }

    case knopQmark:
        Visit(pnode->AsParseNodeTri()->pnode1, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode2, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode3, byteCodeGenerator, prefix, postfix);
        break;
    case knopList:
        VisitList(pnode, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopVarDecl    , "varDcl"    ,None    ,Var  ,fnopNone)
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
        if (pnode->AsParseNodeVar()->pnodeInit != nullptr)
            Visit(pnode->AsParseNodeVar()->pnodeInit, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopFncDecl    , "fncDcl"    ,None    ,Fnc  ,fnopLeaf)
    case knopFncDecl:
    {
        // Inner function declarations are visited before anything else in the scope.
        // (See VisitFunctionsInScope.)
        break;
    }
    case knopClassDecl:
    {
        Visit(pnode->AsParseNodeClass()->pnodeDeclName, byteCodeGenerator, prefix, postfix);
        // Now visit the class name and methods.
        BeginVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        // The extends clause is bound to the scope which contains the class name
        // (and the class name identifier is in a TDZ when the extends clause is evaluated).
        // See ES 2017 14.5.13 Runtime Semantics: ClassDefinitionEvaluation.
        Visit(pnode->AsParseNodeClass()->pnodeExtends, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeName, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeConstructor, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeMembers, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        break;
    }
    case knopStrTemplate:
    {
        // Visit the string node lists only if we do not have a tagged template.
        // We never need to visit the raw strings as they are not used in non-tagged templates and
        // tagged templates will register them as part of the callsite constant object.
        if (!pnode->AsParseNodeStrTemplate()->isTaggedTemplate)
        {
            Visit(pnode->AsParseNodeStrTemplate()->pnodeStringLiterals, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeStrTemplate()->pnodeSubstitutionExpressions, byteCodeGenerator, prefix, postfix);
        break;
    }
    case knopExportDefault:
        Visit(pnode->AsParseNodeExportDefault()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopProg       , "program"    ,None    ,Fnc  ,fnopNone)
    case knopProg:
    {
        // We expect that the global statements have been generated (meaning that the pnodeFncs
        // field is a real pointer, not an enumeration).
        Assert(pnode->AsParseNodeFnc()->pnodeBody);

        uint i = 0;
        VisitNestedScopes(pnode->AsParseNodeFnc()->pnodeScopes, pnode, byteCodeGenerator, prefix, postfix, &i);
        // Visiting global code: track the last value statement.
        BeginVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);
        pnode->AsParseNodeProg()->pnodeLastValStmt = VisitBlock(pnode->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);

        break;
    }
    case knopFor:
        BeginVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeFor()->pnodeInit, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeFor()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeIncr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopIf         , "if"        ,None    ,If   ,fnopNone)
    case knopIf:
        Visit(pnode->AsParseNodeIf()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeIf()->pnodeTrue, byteCodeGenerator, prefix, postfix, pnode);
        if (pnode->AsParseNodeIf()->pnodeFalse != nullptr)
        {
            Visit(pnode->AsParseNodeIf()->pnodeFalse, byteCodeGenerator, prefix, postfix, pnode);
        }
        break;
    // PTNODE(knopWhile      , "while"        ,None    ,While,fnopBreak|fnopContinue)
    // PTNODE(knopDoWhile    , "do-while"    ,None    ,While,fnopBreak|fnopContinue)
    case knopDoWhile:
    case knopWhile:
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeWhile()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeWhile()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        break;
    // PTNODE(knopForIn      , "for in"    ,None    ,ForIn,fnopBreak|fnopContinue|fnopCleanup)
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
        BeginVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeLval, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeObj, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopReturn     , "return"    ,None    ,Uni  ,fnopNone)
    case knopReturn:
        if (pnode->AsParseNodeReturn()->pnodeExpr != nullptr)
            Visit(pnode->AsParseNodeReturn()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopBlock      , "{}"        ,None    ,Block,fnopNone)
    case knopBlock:
    {
        ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
        if (pnodeBlock->pnodeStmt != nullptr)
        {
            BeginVisitBlock(pnodeBlock, byteCodeGenerator);
            pnodeBlock->pnodeLastValStmt = VisitBlock(pnodeBlock->pnodeStmt, byteCodeGenerator, prefix, postfix, pnode);
            EndVisitBlock(pnodeBlock, byteCodeGenerator);
        }
        else
        {
            pnodeBlock->pnodeLastValStmt = nullptr;
        }
        break;
    }
    // PTNODE(knopWith       , "with"        ,None    ,With ,fnopCleanup)
    case knopWith:
        Visit(pnode->AsParseNodeWith()->pnodeObj, byteCodeGenerator, prefix, postfix);
        VisitWithStmt(pnode, pnode->AsParseNodeWith()->pnodeObj->location, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopBreak      , "break"        ,None    ,Jump ,fnopNone)
    case knopBreak:
        // TODO: some representation of target
        break;
    // PTNODE(knopContinue   , "continue"    ,None    ,Jump ,fnopNone)
    case knopContinue:
        // TODO: some representation of target
        break;
    // PTNODE(knopSwitch     , "switch"    ,None    ,Switch,fnopBreak)
    case knopSwitch:
        Visit(pnode->AsParseNodeSwitch()->pnodeVal, byteCodeGenerator, prefix, postfix);
        BeginVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        for (ParseNodeCase *pnodeT = pnode->AsParseNodeSwitch()->pnodeCases; nullptr != pnodeT; pnodeT = pnodeT->pnodeNext)
        {
            Visit(pnodeT, byteCodeGenerator, prefix, postfix, pnode);
        }
        Visit(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopCase       , "case"        ,None    ,Case ,fnopNone)
    case knopCase:
        Visit(pnode->AsParseNodeCase()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCase()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopTypeof:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopTryCatchFinally,"try-catch-finally",None,TryCatchFinally,fnopCleanup)
    case knopTryFinally:
        Visit(pnode->AsParseNodeTryFinally()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryFinally()->pnodeFinally, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTryCatch      , "try-catch" ,None    ,TryCatch  ,fnopCleanup)
    case knopTryCatch:
        Visit(pnode->AsParseNodeTryCatch()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryCatch()->pnodeCatch, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTry        , "try"       ,None    ,Try  ,fnopCleanup)
    case knopTry:
        Visit(pnode->AsParseNodeTry()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopCatch:
        BeginVisitCatch(pnode, byteCodeGenerator);
        Visit(pnode->AsParseNodeCatch()->GetParam(), byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCatch()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        EndVisitCatch(pnode, byteCodeGenerator);
        break;
    case knopFinally:
        Visit(pnode->AsParseNodeFinally()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopThrow      , "throw"     ,None    ,Uni  ,fnopNone)
    case knopThrow:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    case knopArray:
    {
        bool arrayLitOpt = EmitAsConstantArray(pnode, byteCodeGenerator);
        if (!arrayLitOpt)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;
    }
    case knopComma:
    {
        ParseNode *pnode1 = pnode->AsParseNodeBin()->pnode1;
        if (pnode1->nop == knopComma)
        {
            // Spot-fix to avoid recursion on very large comma expressions.
            ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
            SList<ParseNode*> rhsStack(alloc);
            do
            {
                rhsStack.Push(pnode1->AsParseNodeBin()->pnode2);
                pnode1 = pnode1->AsParseNodeBin()->pnode1;
            }
            while (pnode1->nop == knopComma);

            Visit(pnode1, byteCodeGenerator, prefix, postfix);
            while (!rhsStack.Empty())
            {
                ParseNode *pnodeRhs = rhsStack.Pop();
                Visit(pnodeRhs, byteCodeGenerator, prefix, postfix);
            }
        }
        else
        {
            Visit(pnode1, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);
    }
        break;
    }
    if (pnodeParent)
    {
        PropagateFlags(pnode, pnodeParent);
    }
    postfix(pnode, byteCodeGenerator);
}